

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-features.h
# Opt level: O3

string * __thiscall
wasm::FeatureSet::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureSet *this,Feature f)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = (int)this;
  if (iVar2 < 0x800) {
    if (iVar2 < 0x40) {
      switch(iVar2) {
      case 1:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "threads";
        pcVar1 = "";
        break;
      case 2:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "mutable-globals";
        pcVar1 = "";
        break;
      case 3:
      case 5:
      case 6:
      case 7:
switchD_00170b94_caseD_3:
        ::wasm::handle_unreachable
                  ("unexpected feature",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-features.h"
                   ,0x74);
      case 4:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "nontrapping-float-to-int";
        pcVar1 = "";
        break;
      case 8:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "simd";
        pcVar1 = "";
        break;
      default:
        if (iVar2 == 0x10) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "bulk-memory";
          pcVar1 = "";
        }
        else {
          if (iVar2 != 0x20) goto switchD_00170b94_caseD_3;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "sign-ext";
          pcVar1 = "";
        }
      }
    }
    else if (iVar2 < 0x100) {
      if (iVar2 == 0x40) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "exception-handling";
        pcVar1 = "";
      }
      else {
        if (iVar2 != 0x80) goto switchD_00170b94_caseD_3;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "tail-call";
        pcVar1 = "";
      }
    }
    else if (iVar2 == 0x100) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "reference-types";
      pcVar1 = "";
    }
    else if (iVar2 == 0x200) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "multivalue";
      pcVar1 = "";
    }
    else {
      if (iVar2 != 0x400) goto switchD_00170b94_caseD_3;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "gc";
      pcVar1 = "";
    }
  }
  else if (iVar2 < 0x10000) {
    if (iVar2 < 0x2000) {
      if (iVar2 == 0x800) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "memory64";
        pcVar1 = "";
      }
      else {
        if (iVar2 != 0x1000) goto switchD_00170b94_caseD_3;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "relaxed-simd";
        pcVar1 = "";
      }
    }
    else if (iVar2 == 0x2000) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "extended-const";
      pcVar1 = "";
    }
    else if (iVar2 == 0x4000) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "strings";
      pcVar1 = "";
    }
    else {
      if (iVar2 != 0x8000) goto switchD_00170b94_caseD_3;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "multimemory";
      pcVar1 = "";
    }
  }
  else if (iVar2 < 0x80000) {
    if (iVar2 == 0x10000) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "stack-switching";
      pcVar1 = "";
    }
    else if (iVar2 == 0x20000) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "shared-everything";
      pcVar1 = "";
    }
    else {
      if (iVar2 != 0x40000) goto switchD_00170b94_caseD_3;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "fp16";
      pcVar1 = "";
    }
  }
  else if (iVar2 == 0x80000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "bulk-memory-opt";
    pcVar1 = "";
  }
  else if (iVar2 == 0x100000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "call-indirect-overlong";
    pcVar1 = "";
  }
  else {
    if (iVar2 != 0x200000) goto switchD_00170b94_caseD_3;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "custom-descriptors";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(Feature f) {
    switch (f) {
      case Atomics:
        return "threads";
      case MutableGlobals:
        return "mutable-globals";
      case TruncSat:
        return "nontrapping-float-to-int";
      case SIMD:
        return "simd";
      case BulkMemory:
        return "bulk-memory";
      case SignExt:
        return "sign-ext";
      case ExceptionHandling:
        return "exception-handling";
      case TailCall:
        return "tail-call";
      case ReferenceTypes:
        return "reference-types";
      case Multivalue:
        return "multivalue";
      case GC:
        return "gc";
      case Memory64:
        return "memory64";
      case RelaxedSIMD:
        return "relaxed-simd";
      case ExtendedConst:
        return "extended-const";
      case Strings:
        return "strings";
      case MultiMemory:
        return "multimemory";
      case StackSwitching:
        return "stack-switching";
      case SharedEverything:
        return "shared-everything";
      case FP16:
        return "fp16";
      case BulkMemoryOpt:
        return "bulk-memory-opt";
      case CallIndirectOverlong:
        return "call-indirect-overlong";
      case CustomDescriptors:
        return "custom-descriptors";
      case MVP:
      case Default:
      case All:
        break;
    }
    WASM_UNREACHABLE("unexpected feature");
  }